

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O3

bool __thiscall DIS::AggregateStatePdu::operator==(AggregateStatePdu *this,AggregateStatePdu *rhs)

{
  uint uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  pointer pAVar15;
  pointer pEVar16;
  pointer pEVar17;
  pointer pVVar18;
  ulong uVar19;
  long lVar20;
  
  bVar7 = EntityManagementFamilyPdu::operator==
                    (&this->super_EntityManagementFamilyPdu,&rhs->super_EntityManagementFamilyPdu);
  bVar8 = EntityID::operator==(&this->_aggregateID,&rhs->_aggregateID);
  uVar2 = this->_forceID;
  uVar3 = rhs->_forceID;
  uVar4 = rhs->_aggregateState;
  uVar5 = this->_aggregateState;
  bVar9 = EntityType::operator==(&this->_aggregateType,&rhs->_aggregateType);
  uVar6 = this->_formation;
  uVar1 = rhs->_formation;
  bVar10 = AggregateMarking::operator==(&this->_aggregateMarking,&rhs->_aggregateMarking);
  bVar11 = Vector3Float::operator==(&this->_dimensions,&rhs->_dimensions);
  bVar12 = Orientation::operator==(&this->_orientation,&rhs->_orientation);
  bVar13 = Vector3Double::operator==(&this->_centerOfMass,&rhs->_centerOfMass);
  bVar14 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  bVar7 = (uVar5 == uVar4 && (uVar2 == uVar3 && (bVar8 && bVar7))) &&
          (((bVar14 && bVar13) && (bVar12 && (bVar11 && bVar10))) && (uVar6 == uVar1 && bVar9));
  pAVar15 = (this->_aggregateIDList).
            super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_aggregateIDList).
      super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar15) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      bVar8 = AggregateID::operator==
                        ((AggregateID *)((long)&pAVar15->_vptr_AggregateID + lVar20),
                         (AggregateID *)
                         ((long)&((rhs->_aggregateIDList).
                                  super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_AggregateID +
                         lVar20));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar19 = uVar19 + 1;
      pAVar15 = (this->_aggregateIDList).
                super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)(this->_aggregateIDList).
                                    super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar15 >> 4)
            );
  }
  pEVar16 = (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar16) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      bVar8 = EntityID::operator==
                        ((EntityID *)((long)&pEVar16->_vptr_EntityID + lVar20),
                         (EntityID *)
                         ((long)&((rhs->_entityIDList).
                                  super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->_vptr_EntityID + lVar20
                         ));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar19 = uVar19 + 1;
      pEVar16 = (this->_entityIDList).
                super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)(this->_entityIDList).
                                    super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar16 >> 4)
            );
  }
  bVar7 = (bool)(this->_pad2 == rhs->_pad2 & bVar7);
  pEVar17 = (this->_silentAggregateSystemList).
            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_silentAggregateSystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar17) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      bVar8 = EntityType::operator==
                        ((EntityType *)((long)&pEVar17->_vptr_EntityType + lVar20),
                         (EntityType *)
                         ((long)&((rhs->_silentAggregateSystemList).
                                  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                         lVar20));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar19 = uVar19 + 1;
      pEVar17 = (this->_silentAggregateSystemList).
                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)(this->_silentAggregateSystemList).
                                    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar17 >> 4)
            );
  }
  pEVar17 = (this->_silentEntitySystemList).
            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_silentEntitySystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar17) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      bVar8 = EntityType::operator==
                        ((EntityType *)((long)&pEVar17->_vptr_EntityType + lVar20),
                         (EntityType *)
                         ((long)&((rhs->_silentEntitySystemList).
                                  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                         lVar20));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar19 = uVar19 + 1;
      pEVar17 = (this->_silentEntitySystemList).
                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)(this->_silentEntitySystemList).
                                    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar17 >> 4)
            );
  }
  pVVar18 = (this->_variableDatumList).
            super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_variableDatumList).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar18) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      bVar8 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar18->_vptr_VariableDatum + lVar20),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatumList).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar20));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar19 = uVar19 + 1;
      pVVar18 = (this->_variableDatumList).
                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x30;
    } while (uVar19 < (ulong)(((long)(this->_variableDatumList).
                                     super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar18 >> 4
                              ) * -0x5555555555555555));
  }
  return bVar7;
}

Assistant:

bool AggregateStatePdu::operator ==(const AggregateStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityManagementFamilyPdu::operator==(rhs);

     if( ! (_aggregateID == rhs._aggregateID) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_aggregateState == rhs._aggregateState) ) ivarsEqual = false;
     if( ! (_aggregateType == rhs._aggregateType) ) ivarsEqual = false;
     if( ! (_formation == rhs._formation) ) ivarsEqual = false;
     if( ! (_aggregateMarking == rhs._aggregateMarking) ) ivarsEqual = false;
     if( ! (_dimensions == rhs._dimensions) ) ivarsEqual = false;
     if( ! (_orientation == rhs._orientation) ) ivarsEqual = false;
     if( ! (_centerOfMass == rhs._centerOfMass) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        if( ! ( _aggregateIDList[idx] == rhs._aggregateIDList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        if( ! ( _entityIDList[idx] == rhs._entityIDList[idx]) ) ivarsEqual = false;
     }

     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        if( ! ( _silentAggregateSystemList[idx] == rhs._silentAggregateSystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        if( ! ( _silentEntitySystemList[idx] == rhs._silentEntitySystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        if( ! ( _variableDatumList[idx] == rhs._variableDatumList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }